

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

char * __thiscall
CoreML::Specification::CustomLayerParams::_InternalParse
          (CustomLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  ParseContext *this_00;
  bool bVar1;
  WeightParams *msg;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  string *str_1;
  string *str;
  ParseContext *pPStack_20;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  CustomLayerParams *this_local;
  
  pPStack_20 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)this;
LAB_00325b7c:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(pPStack_20,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)
                google::protobuf::internal::ReadTag
                          ((char *)ctx_local,(uint32_t *)((long)&str + 4),0);
    tag_00 = str._4_4_;
    switch(str._4_4_ >> 3) {
    case 10:
      if ((str._4_4_ & 0xff) != 0x52) break;
      psVar2 = _internal_mutable_classname_abi_cxx11_(this);
      ctx_local = (ParseContext *)
                  google::protobuf::internal::InlineGreedyStringParser
                            (psVar2,(char *)ctx_local,pPStack_20);
      bVar1 = google::protobuf::internal::VerifyUTF8(psVar2,(char *)0x0);
joined_r0x00325d84:
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return (char *)0x0;
      }
      goto joined_r0x00325d99;
    default:
      break;
    case 0x14:
      if ((str._4_4_ & 0xff) == 0xa2) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 6);
        do {
          this_00 = pPStack_20;
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 2);
          msg = _internal_add_weights(this);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::ParseContext::ParseMessage
                                (this_00,&msg->super_MessageLite,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) {
            return (char *)0x0;
          }
          bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&pPStack_20->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar1) &&
                (bVar1 = google::protobuf::internal::ExpectTag<162u>((char *)ctx_local), bVar1));
        goto LAB_00325b7c;
      }
      break;
    case 0x1e:
      if ((str._4_4_ & 0xff) == 0xf2) {
        ctx_local = (ParseContext *)((long)&ctx_local[-1].data_.arena + 6);
        do {
          ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 2);
          ctx_local = (ParseContext *)
                      google::protobuf::internal::ParseContext::
                      ParseMessage<google::protobuf::internal::MapFieldLite<CoreML::Specification::CustomLayerParams_ParametersEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_true>
                                (pPStack_20,&this->parameters_,(char *)ctx_local);
          if (ctx_local == (ParseContext *)0x0) {
            return (char *)0x0;
          }
          bVar1 = google::protobuf::internal::EpsCopyInputStream::DataAvailable
                            (&pPStack_20->super_EpsCopyInputStream,(char *)ctx_local);
        } while ((bVar1) &&
                (bVar1 = google::protobuf::internal::ExpectTag<242u>((char *)ctx_local), bVar1));
        goto LAB_00325b7c;
      }
      break;
    case 0x28:
      if ((str._4_4_ & 0xff) == 0x42) {
        psVar2 = _internal_mutable_description_abi_cxx11_(this);
        ctx_local = (ParseContext *)
                    google::protobuf::internal::InlineGreedyStringParser
                              (psVar2,(char *)ctx_local,pPStack_20);
        bVar1 = google::protobuf::internal::VerifyUTF8(psVar2,(char *)0x0);
        goto joined_r0x00325d84;
      }
    }
    if ((str._4_4_ == 0) || ((str._4_4_ & 7) == 4)) {
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      google::protobuf::internal::EpsCopyInputStream::SetLastTag
                (&pPStack_20->super_EpsCopyInputStream,str._4_4_);
      return (char *)ctx_local;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>
                        (&(this->super_MessageLite)._internal_metadata_);
    ctx_local = (ParseContext *)
                google::protobuf::internal::UnknownFieldParse
                          (tag_00,unknown,(char *)ctx_local,pPStack_20);
joined_r0x00325d99:
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* CustomLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // string className = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          auto str = _internal_mutable_classname();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.WeightParams weights = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_weights(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<162>(ptr));
        } else
          goto handle_unusual;
        continue;
      // map<string, .CoreML.Specification.CustomLayerParams.CustomLayerParamValue> parameters = 30;
      case 30:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 242)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(&parameters_, ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<242>(ptr));
        } else
          goto handle_unusual;
        continue;
      // string description = 40;
      case 40:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 66)) {
          auto str = _internal_mutable_description();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}